

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void test_prefix_sum(void)

{
  element_type *peVar1;
  shared_ptr<vmips::VirtReg> local_f0;
  shared_ptr<vmips::CFGNode> local_e0;
  undefined4 local_cc;
  undefined1 local_c8 [8];
  shared_ptr<vmips::VirtReg> updated;
  shared_ptr<vmips::VirtReg> added;
  shared_ptr<vmips::CFGNode> after;
  shared_ptr<vmips::CFGNode> body;
  undefined1 local_78 [8];
  shared_ptr<vmips::VirtReg> current;
  undefined1 local_60 [8];
  shared_ptr<vmips::VirtReg> acc;
  undefined1 local_30 [8];
  shared_ptr<vmips::VirtReg> zero;
  undefined1 local_18 [8];
  shared_ptr<vmips::Function> f;
  
  zero.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
  std::make_shared<vmips::Function,char_const(&)[4],int>((char (*) [4])local_18,(int *)"sum");
  vmips::get_special((SpecialReg)local_30);
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18);
  vmips::Function::entry();
  std::shared_ptr<vmips::CFGNode>::~shared_ptr
            ((shared_ptr<vmips::CFGNode> *)
             &acc.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  current.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0
  ;
  vmips::Function::append<vmips::li,int>((Function *)local_60,(int *)peVar1);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::get_special((int)&body + k0);
  vmips::Function::append<vmips::move,std::shared_ptr<vmips::VirtReg>>
            ((Function *)local_78,(shared_ptr<vmips::VirtReg> *)peVar1);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr
            ((shared_ptr<vmips::VirtReg> *)
             &body.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18);
  vmips::Function::new_section();
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::new_section_branch<vmips::beqz,std::shared_ptr<vmips::VirtReg>&>
            ((Function *)
             &added.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<vmips::VirtReg> *)peVar1);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::switch_to(peVar1);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((Function *)
             &updated.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<vmips::VirtReg> *)peVar1,(shared_ptr<vmips::VirtReg> *)local_60);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  local_cc = 0xffffffff;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((Function *)local_c8,(shared_ptr<vmips::VirtReg> *)peVar1,(int *)local_78);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::add_phi(peVar1,local_60);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::add_phi(peVar1,local_c8);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::branch_existing<vmips::j>
            ((Function *)&local_e0,(shared_ptr<vmips::CFGNode> *)peVar1);
  std::shared_ptr<vmips::CFGNode>::~shared_ptr(&local_e0);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::switch_to(peVar1);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  std::shared_ptr<vmips::VirtReg>::shared_ptr(&local_f0,(shared_ptr<vmips::VirtReg> *)local_60);
  vmips::Function::assign_special(peVar1,2,&local_f0);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_f0);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::output((ostream *)peVar1);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18);
  vmips::Function::color();
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18);
  vmips::Function::scan_overlap();
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18);
  vmips::Function::handle_alloca();
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::output((ostream *)peVar1);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_c8);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr
            ((shared_ptr<vmips::VirtReg> *)
             &updated.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<vmips::CFGNode>::~shared_ptr
            ((shared_ptr<vmips::CFGNode> *)
             &added.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<vmips::CFGNode>::~shared_ptr
            ((shared_ptr<vmips::CFGNode> *)
             &after.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_78);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_60);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_30);
  std::shared_ptr<vmips::Function>::~shared_ptr((shared_ptr<vmips::Function> *)local_18);
  return;
}

Assistant:

void test_prefix_sum() {
    auto f  = std::make_shared<Function>("sum", 1);
    auto zero = get_special(SpecialReg::zero);
    f->entry();
    auto acc = f->append<li>(0);
    auto current = f->append<move>(get_special(SpecialReg::a0));
    auto body = f->new_section();
    auto after = f->new_section_branch<beqz>(current);

    // loop body
    f->switch_to(body);
    auto added = f->append<add>(acc, current);
    auto updated = f->append<addi>(current, -1);
    f->add_phi(acc, added);
    f->add_phi(updated, current);
    f->branch_existing<j>(body);

    // loop tail
    f->switch_to(after);
    f->assign_special(SpecialReg::v0, acc);
    f->output(std::cout);
    std::cout << std::endl;
    f->color();
    f->scan_overlap();
    f->handle_alloca();
    f->output(std::cout);
}